

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O3

int coda_ascbin_cursor_get_available_union_field_index(coda_cursor *cursor,long *index)

{
  coda_type_record *expr;
  int iVar1;
  long lVar2;
  coda_type *pcVar3;
  int64_t index64;
  char s2 [21];
  char s1 [21];
  coda_cursor union_cursor;
  long local_380;
  char local_378 [32];
  char local_358 [32];
  coda_cursor local_338;
  
  pcVar3 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar3->format) {
    pcVar3 = *(coda_type **)&pcVar3->type_class;
  }
  expr = pcVar3[1].attributes;
  if (expr == (coda_type_record *)0x0) {
    coda_set_error(-0x69,"cursor does not refer to a union");
  }
  else {
    if ((long)pcVar3[1].name < 1) {
      __assert_fail("record->num_fields > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                    ,0x379,
                    "int coda_ascbin_cursor_get_available_union_field_index(const coda_cursor *, long *)"
                   );
    }
    memcpy(&local_338,cursor,0x310);
    lVar2 = (long)local_338.n;
    local_338.n = local_338.n + 1;
    local_338.stack[lVar2].type =
         *(coda_dynamic_type_struct **)(*(long *)pcVar3[1].description + 0x10);
    local_338.stack[lVar2].index = -1;
    local_338.stack[lVar2].bit_offset = local_338.stack[lVar2 + -1].bit_offset;
    iVar1 = coda_expression_eval_integer((coda_expression *)expr,&local_338,&local_380);
    if (iVar1 == 0) {
      if ((-1 < local_380) && (local_380 < (long)pcVar3[1].name)) {
        *index = local_380;
        return 0;
      }
      coda_str64(local_380,local_358);
      coda_str64(cursor->stack[(long)cursor->n + -1].bit_offset >> 3,local_378);
      coda_set_error(-300,
                     "possible product error detected (invalid result (%s) from union field expression - num fields = %ld - byte:bit offset = %s:%d)"
                     ,local_358,pcVar3[1].name,local_378,
                     (ulong)((uint)cursor->stack[(long)cursor->n + -1].bit_offset & 7));
    }
    else {
      coda_add_error_message(" for union field expression");
    }
    coda_cursor_add_to_error_message(cursor);
  }
  return -1;
}

Assistant:

int coda_ascbin_cursor_get_available_union_field_index(const coda_cursor *cursor, long *index)
{
    coda_type_record *record = (coda_type_record *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    coda_cursor union_cursor;
    int64_t index64;

    if (record->union_field_expr == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to a union");
        return -1;
    }
    assert(record->num_fields > 0);

    /* find field using the type of the first union field to evaluate the expression */
    union_cursor = *cursor;
    union_cursor.n++;
    union_cursor.stack[union_cursor.n - 1].type = (coda_dynamic_type *)record->field[0]->type;
    union_cursor.stack[union_cursor.n - 1].index = -1;
    union_cursor.stack[union_cursor.n - 1].bit_offset = union_cursor.stack[union_cursor.n - 2].bit_offset;
    if (coda_expression_eval_integer(record->union_field_expr, &union_cursor, &index64) != 0)
    {
        coda_add_error_message(" for union field expression");
        coda_cursor_add_to_error_message(cursor);
        return -1;
    }
    if (index64 < 0 || index64 >= record->num_fields)
    {
        char s1[21];
        char s2[21];

        coda_str64(index64, s1);
        coda_str64((cursor->stack[cursor->n - 1].bit_offset >> 3), s2);
        coda_set_error(CODA_ERROR_PRODUCT,
                       "possible product error detected (invalid result (%s) from union field expression - "
                       "num fields = %ld - byte:bit offset = %s:%d)", s1, record->num_fields, s2,
                       (int)(cursor->stack[cursor->n - 1].bit_offset & 0x7));
        coda_cursor_add_to_error_message(cursor);
        return -1;
    }
    *index = (long)index64;

    return 0;
}